

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ArrayJoinPromiseNodeBase::Branch::~Branch(Branch *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&this->dependency);
  Event::~Event(&this->super_Event);
  return;
}

Assistant:

ArrayJoinPromiseNodeBase::Branch::~Branch() noexcept(false) {}